

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bwt_merger.hpp
# Opt level: O2

void next_leaves(dna_bwt_t *bwt1,dna_bwt_t *bwt2,sa_leaf *L1,sa_leaf *L2,
                vector<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>
                *TMP_LEAVES,int *t,int min_size)

{
  uint64_t uVar1;
  uint64_t uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  pointer ppVar7;
  ulong uVar8;
  bool bVar9;
  p_range ext_2;
  p_range ext_1;
  ulong uVar6;
  
  uVar8 = (ulong)min_size;
  dna_bwt<dna_string>::LF(&ext_1,bwt1,L1->rn);
  dna_bwt<dna_string>::LF(&ext_2,bwt2,L2->rn);
  *t = 0;
  bVar9 = uVar8 <= ((ext_1.A.second - ext_1.A.first) - ext_2.A.first) + ext_2.A.second;
  if (bVar9) {
    uVar1 = L1->depth;
    uVar2 = L2->depth;
    *t = 1;
    ppVar7 = (TMP_LEAVES->
             super__Vector_base<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    (ppVar7->first).rn.first = ext_1.A.first;
    (ppVar7->first).rn.second = ext_1.A.second;
    (ppVar7->first).depth = uVar1 + 1;
    (ppVar7->second).rn.first = ext_2.A.first;
    (ppVar7->second).rn.second = ext_2.A.second;
    (ppVar7->second).depth = uVar2 + 1;
  }
  uVar6 = (ulong)bVar9;
  uVar5 = uVar6;
  if (uVar8 <= ((ext_1.C.second - ext_1.C.first) - ext_2.C.first) + ext_2.C.second) {
    uVar1 = L1->depth;
    uVar2 = L2->depth;
    uVar5 = (ulong)(bVar9 + 1);
    *t = bVar9 + 1;
    ppVar7 = (TMP_LEAVES->
             super__Vector_base<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppVar7[uVar6].first.rn.first = ext_1.C.first;
    ppVar7[uVar6].first.rn.second = ext_1.C.second;
    ppVar7[uVar6].first.depth = uVar1 + 1;
    ppVar7[uVar6].second.rn.first = ext_2.C.first;
    ppVar7[uVar6].second.rn.second = ext_2.C.second;
    ppVar7[uVar6].second.depth = uVar2 + 1;
  }
  uVar6 = uVar5;
  if (uVar8 <= ((ext_1.G.second - ext_1.G.first) - ext_2.G.first) + ext_2.G.second) {
    uVar1 = L1->depth;
    uVar2 = L2->depth;
    uVar4 = (int)uVar5 + 1;
    uVar6 = (ulong)uVar4;
    *t = uVar4;
    ppVar7 = (TMP_LEAVES->
             super__Vector_base<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppVar7[uVar5].first.rn.first = ext_1.G.first;
    ppVar7[uVar5].first.rn.second = ext_1.G.second;
    ppVar7[uVar5].first.depth = uVar1 + 1;
    ppVar7[uVar5].second.rn.first = ext_2.G.first;
    ppVar7[uVar5].second.rn.second = ext_2.G.second;
    ppVar7[uVar5].second.depth = uVar2 + 1;
  }
  if (((ext_1.T.second - ext_1.T.first) - ext_2.T.first) + ext_2.T.second < uVar8) {
    if ((int)uVar6 == 0) {
      return;
    }
    ppVar7 = (TMP_LEAVES->
             super__Vector_base<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar8 = uVar6;
  }
  else {
    uVar1 = L1->depth;
    uVar2 = L2->depth;
    uVar4 = (int)uVar6 + 1;
    uVar8 = (ulong)uVar4;
    *t = uVar4;
    ppVar7 = (TMP_LEAVES->
             super__Vector_base<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    ppVar7[uVar6].first.rn.first = ext_1.T.first;
    ppVar7[uVar6].first.rn.second = ext_1.T.second;
    ppVar7[uVar6].first.depth = uVar1 + 1;
    ppVar7[uVar6].second.rn.first = ext_2.T.first;
    ppVar7[uVar6].second.rn.second = ext_2.T.second;
    ppVar7[uVar6].second.depth = uVar2 + 1;
    ppVar7 = (TMP_LEAVES->
             super__Vector_base<std::pair<sa_leaf,_sa_leaf>,_std::allocator<std::pair<sa_leaf,_sa_leaf>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  }
  lVar3 = 0x3f;
  if (uVar8 != 0) {
    for (; uVar8 >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  std::
  __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<sa_leaf,sa_leaf>*,std::vector<std::pair<sa_leaf,sa_leaf>,std::allocator<std::pair<sa_leaf,sa_leaf>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<next_leaves(dna_bwt<dna_string>*,dna_bwt<dna_string>*,sa_leaf&,sa_leaf&,std::vector<std::pair<sa_leaf,sa_leaf>,std::allocator<std::pair<sa_leaf,sa_leaf>>>&,int&,int)::__0>>
            (ppVar7,ppVar7 + uVar8,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
  std::
  __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<sa_leaf,sa_leaf>*,std::vector<std::pair<sa_leaf,sa_leaf>,std::allocator<std::pair<sa_leaf,sa_leaf>>>>,__gnu_cxx::__ops::_Iter_comp_iter<next_leaves(dna_bwt<dna_string>*,dna_bwt<dna_string>*,sa_leaf&,sa_leaf&,std::vector<std::pair<sa_leaf,sa_leaf>,std::allocator<std::pair<sa_leaf,sa_leaf>>>&,int&,int)::__0>>
            (ppVar7,ppVar7 + uVar8);
  return;
}

Assistant:

void next_leaves(dna_bwt_t * bwt1, dna_bwt_t * bwt2, sa_leaf & L1, sa_leaf & L2, vector<pair<sa_leaf, sa_leaf> > & TMP_LEAVES, int & t, int min_size){

	p_range ext_1 = bwt1->LF(L1.rn);
	p_range ext_2 = bwt2->LF(L2.rn);

	//push non-empty leaves on stack in decreasing size order

	t = 0;

	if(range_length(ext_1.A) + range_length(ext_2.A) >= min_size) TMP_LEAVES[t++] = {{ext_1.A, L1.depth+1},{ext_2.A, L2.depth+1}};
	if(range_length(ext_1.C) + range_length(ext_2.C) >= min_size) TMP_LEAVES[t++] = {{ext_1.C, L1.depth+1},{ext_2.C, L2.depth+1}};
	if(range_length(ext_1.G) + range_length(ext_2.G) >= min_size) TMP_LEAVES[t++] = {{ext_1.G, L1.depth+1},{ext_2.G, L2.depth+1}};
	if(range_length(ext_1.T) + range_length(ext_2.T) >= min_size) TMP_LEAVES[t++] = {{ext_1.T, L1.depth+1},{ext_2.T, L2.depth+1}};

	std::sort( TMP_LEAVES.begin(), TMP_LEAVES.begin()+t, [ ]( const pair<sa_leaf, sa_leaf>& lhs, const pair<sa_leaf, sa_leaf>& rhs )
	{
		return leaf_size(lhs) < leaf_size(rhs);
	});

}